

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O1

int secp256k1_der_read_len(size_t *len,uchar **sigp,uchar *sigend)

{
  byte *pbVar1;
  byte bVar2;
  uchar uVar3;
  byte *pbVar4;
  uchar *puVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uchar *sigend_00;
  int iVar10;
  size_t sVar11;
  int iStack_5c;
  ulong uStack_58;
  uchar auStack_50 [40];
  
  if (len != (size_t *)0x0) {
    *len = 0;
    pbVar4 = *sigp;
    uVar6 = 0;
    if (pbVar4 < sigend) {
      pbVar1 = pbVar4 + 1;
      *sigp = pbVar1;
      bVar2 = *pbVar4;
      if ((ulong)bVar2 != 0xff) {
        if ((char)bVar2 < '\0') {
          if (bVar2 != 0x80) {
            uVar8 = bVar2 & 0x7f;
            uVar9 = (ulong)uVar8;
            if (((uVar9 <= (ulong)((long)sigend - (long)pbVar1)) && ((byte)uVar8 < 9)) &&
               (*pbVar1 != 0)) {
              if (uVar9 != 0) {
                sVar11 = *len;
                pbVar4 = *sigp;
                do {
                  sVar11 = sVar11 << 8 | (ulong)*pbVar4;
                  *len = sVar11;
                  *sigp = pbVar4 + 1;
                  uVar9 = uVar9 - 1;
                  pbVar4 = pbVar4 + 1;
                } while (uVar9 != 0);
              }
              if (*len <= (ulong)((long)sigend - (long)*sigp)) {
                uVar6 = (uint)(0x7f < *len);
              }
            }
          }
        }
        else {
          *len = (ulong)bVar2;
          uVar6 = 1;
        }
      }
    }
    return uVar6;
  }
  secp256k1_der_read_len_cold_1();
  iStack_5c = 0;
  auStack_50[0x10] = '\0';
  auStack_50[0x11] = '\0';
  auStack_50[0x12] = '\0';
  auStack_50[0x13] = '\0';
  auStack_50[0x14] = '\0';
  auStack_50[0x15] = '\0';
  auStack_50[0x16] = '\0';
  auStack_50[0x17] = '\0';
  auStack_50[0x18] = '\0';
  auStack_50[0x19] = '\0';
  auStack_50[0x1a] = '\0';
  auStack_50[0x1b] = '\0';
  auStack_50[0x1c] = '\0';
  auStack_50[0x1d] = '\0';
  auStack_50[0x1e] = '\0';
  auStack_50[0x1f] = '\0';
  auStack_50[0] = '\0';
  auStack_50[1] = '\0';
  auStack_50[2] = '\0';
  auStack_50[3] = '\0';
  auStack_50[4] = '\0';
  auStack_50[5] = '\0';
  auStack_50[6] = '\0';
  auStack_50[7] = '\0';
  auStack_50[8] = '\0';
  auStack_50[9] = '\0';
  auStack_50[10] = '\0';
  auStack_50[0xb] = '\0';
  auStack_50[0xc] = '\0';
  auStack_50[0xd] = '\0';
  auStack_50[0xe] = '\0';
  auStack_50[0xf] = '\0';
  puVar5 = *sigp;
  iVar7 = 0;
  iVar10 = 0;
  if ((puVar5 != sigend_00) && (iVar10 = iVar7, *puVar5 == '\x02')) {
    *sigp = puVar5 + 1;
    iVar7 = secp256k1_der_read_len(&uStack_58,sigp,sigend_00);
    if ((((iVar7 != 0) &&
         ((uStack_58 != 0 && (puVar5 = *sigp, uStack_58 <= (ulong)((long)sigend_00 - (long)puVar5)))
         )) && ((uVar3 = *puVar5, uStack_58 == 1 || uVar3 != '\0' || ((char)puVar5[1] < '\0')))) &&
       ((uStack_58 == 1 || uVar3 != 0xff || (-1 < (char)puVar5[1])))) {
      if ((char)uVar3 < '\0') {
        iStack_5c = 1;
      }
      if (*puVar5 == '\0') {
        uStack_58 = uStack_58 - 1;
        *sigp = puVar5 + 1;
      }
      if (0x20 < uStack_58) {
        iStack_5c = 1;
      }
      if (iStack_5c == 0) {
        if (uStack_58 != 0) {
          memcpy(auStack_50 + (0x20 - uStack_58),*sigp,uStack_58);
        }
        secp256k1_scalar_set_b32((secp256k1_scalar *)len,auStack_50,&iStack_5c);
      }
      if (iStack_5c != 0) {
        *(undefined4 *)len = 0;
        secp256k1_scalar_verify((secp256k1_scalar *)len);
      }
      *sigp = *sigp + uStack_58;
      iVar10 = 1;
    }
  }
  return iVar10;
}

Assistant:

static int secp256k1_der_read_len(size_t *len, const unsigned char **sigp, const unsigned char *sigend) {
    size_t lenleft;
    unsigned char b1;
    VERIFY_CHECK(len != NULL);
    *len = 0;
    if (*sigp >= sigend) {
        return 0;
    }
    b1 = *((*sigp)++);
    if (b1 == 0xFF) {
        /* X.690-0207 8.1.3.5.c the value 0xFF shall not be used. */
        return 0;
    }
    if ((b1 & 0x80) == 0) {
        /* X.690-0207 8.1.3.4 short form length octets */
        *len = b1;
        return 1;
    }
    if (b1 == 0x80) {
        /* Indefinite length is not allowed in DER. */
        return 0;
    }
    /* X.690-207 8.1.3.5 long form length octets */
    lenleft = b1 & 0x7F; /* lenleft is at least 1 */
    if (lenleft > (size_t)(sigend - *sigp)) {
        return 0;
    }
    if (**sigp == 0) {
        /* Not the shortest possible length encoding. */
        return 0;
    }
    if (lenleft > sizeof(size_t)) {
        /* The resulting length would exceed the range of a size_t, so
         * it is certainly longer than the passed array size. */
        return 0;
    }
    while (lenleft > 0) {
        *len = (*len << 8) | **sigp;
        (*sigp)++;
        lenleft--;
    }
    if (*len > (size_t)(sigend - *sigp)) {
        /* Result exceeds the length of the passed array.
           (Checking this is the responsibility of the caller but it
           can't hurt do it here, too.) */
        return 0;
    }
    if (*len < 128) {
        /* Not the shortest possible length encoding. */
        return 0;
    }
    return 1;
}